

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.h
# Opt level: O0

void __thiscall CP::list<int>::replace(list<int> *this,int *x,list<int> *y)

{
  iterator this_00;
  bool bVar1;
  int *piVar2;
  int local_5c;
  iterator iStack_58;
  int val;
  iterator __end0;
  iterator __begin0;
  list<int> *__range4;
  list_iterator local_30;
  list_iterator local_28;
  iterator it;
  list<int> *y_local;
  int *x_local;
  list<int> *this_local;
  
  it.ptr = (node *)y;
  local_28.ptr = (node *)begin(this);
  while( true ) {
    local_30.ptr = (node *)end(this);
    bVar1 = list_iterator::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    piVar2 = list_iterator::operator*(&local_28);
    if (*piVar2 == *x) {
      local_28.ptr = (node *)erase(this,local_28.ptr);
      this_00 = it;
      __end0 = begin(it.ptr);
      iStack_58 = end(this_00.ptr);
      while (bVar1 = list_iterator::operator!=(&__end0,&stack0xffffffffffffffa8), bVar1) {
        piVar2 = list_iterator::operator*(&__end0);
        local_5c = *piVar2;
        insert(this,(iterator)local_28.ptr,&local_5c);
        list_iterator::operator++(&__end0);
      }
    }
    else {
      list_iterator::operator++(&local_28);
    }
  }
  return;
}

Assistant:

void replace(const T &x, list<T> &y) {
    auto it = begin();
    while (it != end()) {
        if (*it == x) {
            it = erase(it);
            for (auto val : y) {
                insert(it, val);
            }
        } else {
            ++it;
        }
    }
}